

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__psd_decode_rle(stbi__context *s,stbi_uc *p,int pixelCount)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  byte *pbVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  
  if (0 < pixelCount) {
    iVar6 = 0;
    uVar5 = pixelCount;
    do {
      pbVar3 = s->img_buffer;
      if (pbVar3 < s->img_buffer_end) {
LAB_001ba70a:
        pbVar4 = pbVar3 + 1;
        s->img_buffer = pbVar4;
        bVar1 = *pbVar3;
        uVar7 = (uint)bVar1;
        if (bVar1 != 0x80) {
          if (-1 < (char)bVar1) {
            if (uVar5 <= bVar1) {
              return 0;
            }
            goto LAB_001ba738;
          }
          uVar7 = 0x101 - bVar1;
          if (uVar5 < uVar7) {
            return 0;
          }
          if (pbVar4 < s->img_buffer_end) {
LAB_001ba7b2:
            s->img_buffer = pbVar4 + 1;
            bVar2 = *pbVar4;
          }
          else {
            if (s->read_from_callbacks != 0) {
              stbi__refill_buffer(s);
              pbVar4 = s->img_buffer;
              goto LAB_001ba7b2;
            }
            bVar2 = 0;
          }
          iVar8 = bVar1 - 0x101;
          do {
            *p = bVar2;
            p = p + 4;
            iVar8 = iVar8 + 1;
          } while (iVar8 != 0);
          goto LAB_001ba7d5;
        }
      }
      else {
        if (s->read_from_callbacks != 0) {
          stbi__refill_buffer(s);
          pbVar3 = s->img_buffer;
          goto LAB_001ba70a;
        }
        uVar7 = 0;
LAB_001ba738:
        uVar7 = uVar7 + 1;
        uVar5 = uVar7;
        do {
          pbVar3 = s->img_buffer;
          if (pbVar3 < s->img_buffer_end) {
LAB_001ba764:
            s->img_buffer = pbVar3 + 1;
            bVar1 = *pbVar3;
          }
          else {
            if (s->read_from_callbacks != 0) {
              stbi__refill_buffer(s);
              pbVar3 = s->img_buffer;
              goto LAB_001ba764;
            }
            bVar1 = 0;
          }
          *p = bVar1;
          p = p + 4;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
LAB_001ba7d5:
        iVar6 = iVar6 + uVar7;
      }
      uVar5 = pixelCount - iVar6;
    } while (uVar5 != 0 && iVar6 <= pixelCount);
  }
  return 1;
}

Assistant:

static int stbi__psd_decode_rle(stbi__context *s, stbi_uc *p, int pixelCount)
{
   int count, nleft, len;

   count = 0;
   while ((nleft = pixelCount - count) > 0) {
      len = stbi__get8(s);
      if (len == 128) {
         // No-op.
      } else if (len < 128) {
         // Copy next len+1 bytes literally.
         len++;
         if (len > nleft) return 0; // corrupt data
         count += len;
         while (len) {
            *p = stbi__get8(s);
            p += 4;
            len--;
         }
      } else if (len > 128) {
         stbi_uc   val;
         // Next -len+1 bytes in the dest are replicated from next source byte.
         // (Interpret len as a negative 8-bit int.)
         len = 257 - len;
         if (len > nleft) return 0; // corrupt data
         val = stbi__get8(s);
         count += len;
         while (len) {
            *p = val;
            p += 4;
            len--;
         }
      }
   }

   return 1;
}